

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

int Bac_PtrMemoryNtk(Vec_Ptr_t *vNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar7 = 0;
  iVar6 = 0;
  if (vNtk != (Vec_Ptr_t *)0x0) {
    iVar6 = vNtk->nCap;
    auVar8._8_4_ = iVar6 >> 0x1f;
    auVar8._0_8_ = (long)iVar6;
    auVar8._12_4_ = 0x45300000;
    iVar6 = (int)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  piVar4 = (int *)Vec_PtrEntry(vNtk,1);
  if (piVar4 != (int *)0x0) {
    iVar7 = *piVar4;
    auVar9._8_4_ = iVar7 >> 0x1f;
    auVar9._0_8_ = (long)iVar7;
    auVar9._12_4_ = 0x45300000;
    iVar7 = (int)(((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  piVar4 = (int *)Vec_PtrEntry(vNtk,2);
  if (piVar4 == (int *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = *piVar4;
    auVar10._8_4_ = iVar1 >> 0x1f;
    auVar10._0_8_ = (long)iVar1;
    auVar10._12_4_ = 0x45300000;
    iVar1 = (int)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,3);
  iVar2 = Bac_PtrMemoryArrayArray(pVVar5);
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  iVar3 = Bac_PtrMemoryArrayArray(pVVar5);
  return iVar3 + iVar2 + iVar7 + iVar6 + iVar1;
}

Assistant:

int Bac_PtrMemoryNtk( Vec_Ptr_t * vNtk )
{
    int nBytes = (int)Vec_PtrMemory(vNtk);
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    return nBytes;
}